

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetBox2iAttribute(ImfHeader *hdr,char *name,int xMin,int yMin,int xMax,int yMax)

{
  Vec2<int> VVar1;
  Vec2<int> VVar2;
  Iterator IVar3;
  iterator iVar4;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *pTVar5;
  Box2i box;
  Box<Imath_3_2::Vec2<int>_> local_48;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> local_30;
  
  local_48.min.x = xMin;
  local_48.min.y = yMin;
  local_48.max.x = xMax;
  local_48.max.y = yMax;
  IVar3 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar4._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar3._i._M_node == (iterator)iVar4._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
              (&local_30,&local_48);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_30.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute(&local_30);
  }
  else {
    pTVar5 = Imf_3_4::Header::
             typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                       ((Header *)hdr,name);
    VVar1.y = local_48.min.y;
    VVar1.x = local_48.min.x;
    VVar2.y = local_48.max.y;
    VVar2.x = local_48.max.x;
    (pTVar5->_value).min = VVar1;
    (pTVar5->_value).max = VVar2;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetBox2iAttribute (
    ImfHeader* hdr, const char name[], int xMin, int yMin, int xMax, int yMax)
{
    try
    {
        Box2i box (V2i (xMin, yMin), V2i (xMax, yMax));

        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::Box2iAttribute (box));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::Box2iAttribute> (name)
                .value () = box;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}